

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

ReadFileResult
cmCMakePresetsGraphInternal::PresetOptionalBoolHelper(optional<bool> *out,Value *value)

{
  ReadFileResult RVar1;
  Value *local_18;
  
  if (PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*)::helper == '\0') {
    PresetOptionalBoolHelper();
  }
  local_18 = value;
  if (PresetOptionalBoolHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    RVar1 = (*PresetOptionalBoolHelper::helper._M_invoker)
                      ((_Any_data *)&PresetOptionalBoolHelper::helper,out,&local_18);
    return RVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetOptionalBoolHelper(
  cm::optional<bool>& out, const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Optional<bool>(
    ReadFileResult::READ_OK, PresetBoolHelper);

  return helper(out, value);
}